

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O0

vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *
deqp::gles3::Functional::anon_unknown_0::getPointsFromSamples
          (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
           *__return_storage_ptr__,
          vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
          *samples,offset_in_Sample_to_unknown field)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  float local_74;
  Vector<float,_2> local_48;
  ulong local_40;
  size_t ndx;
  allocator<tcu::Vector<float,_2>_> local_22;
  undefined1 local_21;
  offset_in_Sample_to_unknown local_20;
  offset_in_Sample_to_unknown field_local;
  vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  *samples_local;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *points;
  
  local_21 = 0;
  local_20 = field;
  field_local = (offset_in_Sample_to_unknown)samples;
  samples_local =
       (vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
        *)__return_storage_ptr__;
  sVar3 = std::
          vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
          ::size(samples);
  std::allocator<tcu::Vector<float,_2>_>::allocator(&local_22);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (__return_storage_ptr__,sVar3,&local_22);
  std::allocator<tcu::Vector<float,_2>_>::~allocator(&local_22);
  for (local_40 = 0; uVar2 = local_40,
      sVar3 = std::
              vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
              ::size((vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                      *)field_local), uVar2 < sVar3; local_40 = local_40 + 1) {
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
             ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                           *)field_local,local_40);
    iVar1 = pvVar4->numDrawCalls;
    pvVar4 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
             ::operator[]((vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                           *)field_local,local_40);
    local_74 = (float)*(ulong *)((long)&pvVar4->numDrawCalls + local_20);
    tcu::Vector<float,_2>::Vector(&local_48,(float)iVar1,local_74);
    pvVar5 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       (__return_storage_ptr__,local_40);
    *&pvVar5->m_data = local_48.m_data;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vec2> getPointsFromSamples (const std::vector<FlushFinishCase::Sample>& samples, const deUint64 FlushFinishCase::Sample::*field)
{
	vector<Vec2> points(samples.size());

	for (size_t ndx = 0; ndx < samples.size(); ndx++)
		points[ndx] = Vec2(float(samples[ndx].numDrawCalls), float(samples[ndx].*field));

	return points;
}